

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_music.cpp
# Opt level: O0

MusInfo * I_RegisterSong(FileReader *reader,MidiDeviceSetting *device)

{
  EMidiDevice devtype_00;
  DWORD miditype_00;
  MemoryArrayReader *data;
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  undefined4 extraout_var_01;
  MemoryArrayReader *this;
  TArray<unsigned_char,_unsigned_char> *newdata;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char *fmt_00;
  ulong uVar5;
  char *local_130;
  char *local_108;
  EMidiDevice local_ec;
  int local_88;
  EMidiDevice local_84;
  DWORD subid;
  EMidiDevice devtype;
  EMIDIType miditype;
  MemoryArrayReader *local_70;
  MemoryArrayReader *memreader;
  BYTE *gzipped;
  uint local_58;
  int len;
  DWORD id [8];
  char *fmt;
  MusInfo *info;
  MidiDeviceSetting *device_local;
  FileReader *reader_local;
  
  if (nomusic == 0) {
    iVar2 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])(reader,&local_58,0x20);
    if ((CONCAT44(extraout_var,iVar2) == 0x20) &&
       (iVar2 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[4])
                          (reader,0xffffffffffffffe0,1), CONCAT44(extraout_var_00,iVar2) == 0)) {
      device_local = (MidiDeviceSetting *)reader;
      if ((local_58 & 0xffffff) == 0x88b1f) {
        lVar4 = FileReader::GetLength(reader);
        gzipped._4_4_ = (int)lVar4;
        memreader = (MemoryArrayReader *)operator_new__((long)gzipped._4_4_);
        iVar2 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])
                          (reader,memreader,(long)gzipped._4_4_);
        if (CONCAT44(extraout_var_01,iVar2) != (long)gzipped._4_4_) {
          if (memreader != (MemoryArrayReader *)0x0) {
            operator_delete__(memreader);
          }
          if (reader != (FileReader *)0x0) {
            (*(reader->super_FileReaderBase)._vptr_FileReaderBase[1])();
          }
          return (MusInfo *)0x0;
        }
        if (reader != (FileReader *)0x0) {
          (*(reader->super_FileReaderBase)._vptr_FileReaderBase[1])();
        }
        this = (MemoryArrayReader *)operator_new(0x40);
        MemoryArrayReader::MemoryArrayReader(this,(char *)0x0,0);
        iVar2 = gzipped._4_4_;
        data = memreader;
        local_70 = this;
        newdata = MemoryArrayReader::GetArray(this);
        bVar1 = ungzip((BYTE *)data,iVar2,newdata);
        if (!bVar1) {
          if (memreader != (MemoryArrayReader *)0x0) {
            operator_delete__(memreader);
          }
          if (local_70 != (MemoryArrayReader *)0x0) {
            (*(local_70->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[1])();
          }
          return (MusInfo *)0x0;
        }
        if (memreader != (MemoryArrayReader *)0x0) {
          operator_delete__(memreader);
        }
        MemoryArrayReader::UpdateLength(local_70);
        iVar2 = (*(local_70->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
                          (local_70,&local_58,0x20);
        if ((CONCAT44(extraout_var_02,iVar2) != 0x20) ||
           (iVar2 = (*(local_70->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[4])
                              (local_70,0xffffffffffffffe0,1), CONCAT44(extraout_var_03,iVar2) != 0)
           ) {
          if (local_70 != (MemoryArrayReader *)0x0) {
            (*(local_70->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[1])();
          }
          return (MusInfo *)0x0;
        }
        device_local = (MidiDeviceSetting *)local_70;
      }
      subid = IdentifyMIDIType(&local_58,0x20);
      if (subid == MIDI_NOTMIDI) {
        if ((((local_58 == 0x41574152) && (len == 0x41544144)) ||
            ((local_58 == 0x41524244 && (len == 0x4c504f57)))) ||
           ((local_58 == 0x494c4441 && ((char)len == 'B')))) {
          fmt = (char *)operator_new(0x20);
          if (device == (MidiDeviceSetting *)0x0) {
            local_130 = "";
          }
          else {
            local_130 = FString::GetChars(&device->args);
          }
          OPLMUSSong::OPLMUSSong((OPLMUSSong *)fmt,(FileReader *)device_local,local_130);
        }
        else {
          fmt_00 = GME_CheckFormat(local_58);
          if ((fmt_00 == (char *)0x0) || (*fmt_00 == '\0')) {
            fmt = (char *)MOD_OpenSong((FileReader *)device_local);
          }
          else {
            fmt = (char *)GME_OpenSong((FileReader *)device_local,fmt_00);
          }
        }
      }
      else {
        if (device == (MidiDeviceSetting *)0x0) {
          local_ec = MDEV_DEFAULT;
        }
        else {
          local_ec = device->device;
        }
        local_84 = local_ec;
        if (local_ec == MDEV_MMAPI) {
          local_84 = MDEV_SNDSYS;
        }
        while( true ) {
          miditype_00 = subid;
          devtype_00 = local_84;
          if (device == (MidiDeviceSetting *)0x0) {
            local_108 = "";
          }
          else {
            local_108 = FString::GetChars(&device->args);
          }
          fmt = (char *)CreateMIDIStreamer((FileReader *)device_local,devtype_00,miditype_00,
                                           local_108);
          if (((MIDIStreamer *)fmt != (MIDIStreamer *)0x0) &&
             (uVar3 = (*(((MIDIStreamer *)fmt)->super_MusInfo)._vptr_MusInfo[10])(),
             (uVar3 & 1) == 0)) {
            if ((MIDIStreamer *)fmt != (MIDIStreamer *)0x0) {
              (*(((MIDIStreamer *)fmt)->super_MusInfo)._vptr_MusInfo[1])();
            }
            fmt = (char *)0x0;
          }
          if (((fmt != (char *)0x0) || (local_84 == MDEV_SNDSYS)) ||
             (iVar2 = FIntCVar::operator_cast_to_int(&snd_mididevice), -1 < iVar2)) break;
          local_84 = MDEV_SNDSYS;
        }
      }
      if (fmt == (char *)0x0) {
        if (local_58 == 0x46464952) {
          (**(code **)(*(long *)device_local + 0x20))(device_local,8,1);
          lVar4 = (**(code **)(*(long *)device_local + 0x10))(device_local,&local_88,4);
          if (lVar4 != 4) {
            if (device_local != (MidiDeviceSetting *)0x0) {
              (**(code **)(*(long *)device_local + 8))();
            }
            return (MusInfo *)0x0;
          }
          (**(code **)(*(long *)device_local + 0x20))(device_local,0xfffffffffffffff4,1);
          if (local_88 == 0x41444443) {
            fmt = (char *)operator_new(0x18);
            CDDAFile::CDDAFile((CDDAFile *)fmt,(FileReader *)device_local);
          }
        }
        if ((fmt == (char *)0x0) &&
           ((lVar4 = FileReader::GetLength((FileReader *)device_local), 0x3ff < lVar4 ||
            (local_58 == 0x6468544d)))) {
          fmt = (char *)operator_new(0x18);
          StreamSong::StreamSong((StreamSong *)fmt,(FileReader *)device_local);
          device_local = (MidiDeviceSetting *)0x0;
        }
      }
      if ((device_local != (MidiDeviceSetting *)0x0) && (device_local != (MidiDeviceSetting *)0x0))
      {
        (**(code **)(*(long *)device_local + 8))();
      }
      if ((fmt != (char *)0x0) && (uVar5 = (**(code **)(*(long *)fmt + 0x50))(), (uVar5 & 1) == 0))
      {
        if (fmt != (char *)0x0) {
          (**(code **)(*(long *)fmt + 8))();
        }
        fmt = (char *)0x0;
      }
      reader_local = (FileReader *)fmt;
    }
    else {
      if (reader != (FileReader *)0x0) {
        (*(reader->super_FileReaderBase)._vptr_FileReaderBase[1])();
      }
      reader_local = (FileReader *)0x0;
    }
  }
  else {
    if (reader != (FileReader *)0x0) {
      (*(reader->super_FileReaderBase)._vptr_FileReaderBase[1])();
    }
    reader_local = (FileReader *)0x0;
  }
  return (MusInfo *)reader_local;
}

Assistant:

MusInfo *I_RegisterSong (FileReader *reader, MidiDeviceSetting *device)
{
	MusInfo *info = NULL;
	const char *fmt;
	DWORD id[32/4];

	if (nomusic)
	{
		delete reader;
		return 0;
	}

	if(reader->Read(id, 32) != 32 || reader->Seek(-32, SEEK_CUR) != 0)
	{
		delete reader;
		return 0;
	}

    // Check for gzip compression. Some formats are expected to have players
    // that can handle it, so it simplifies things if we make all songs
    // gzippable.
	if ((id[0] & MAKE_ID(255, 255, 255, 0)) == GZIP_ID)
	{
		int len = reader->GetLength();
		BYTE *gzipped = new BYTE[len];
		if (reader->Read(gzipped, len) != len)
		{
			delete[] gzipped;
			delete reader;
			return NULL;
		}
		delete reader;

		MemoryArrayReader *memreader = new MemoryArrayReader(NULL, 0);
		if (!ungzip(gzipped, len, memreader->GetArray()))
		{
			delete[] gzipped;
			delete memreader;
			return 0;
		}
		delete[] gzipped;
		memreader->UpdateLength();

		if (memreader->Read(id, 32) != 32 || memreader->Seek(-32, SEEK_CUR) != 0)
		{
			delete memreader;
			return 0;
		}
		reader = memreader;
	}

	EMIDIType miditype = IdentifyMIDIType(id, sizeof(id));
	if (miditype != MIDI_NOTMIDI)
	{
		EMidiDevice devtype = device == NULL? MDEV_DEFAULT : (EMidiDevice)device->device;
#ifndef _WIN32
		// non-Windows platforms don't support MDEV_MMAPI so map to MDEV_SNDSYS
		if (devtype == MDEV_MMAPI)
			devtype = MDEV_SNDSYS;
#endif

retry_as_sndsys:
		info = CreateMIDIStreamer(*reader, devtype, miditype, device != NULL? device->args.GetChars() : "");
		if (info != NULL && !info->IsValid())
		{
			delete info;
			info = NULL;
		}
		if (info == NULL && devtype != MDEV_SNDSYS && snd_mididevice < 0)
		{
			devtype = MDEV_SNDSYS;
			goto retry_as_sndsys;
		}
#ifdef _WIN32
		if (info == NULL && devtype != MDEV_MMAPI && snd_mididevice >= 0)
		{
			info = CreateMIDIStreamer(*reader, MDEV_MMAPI, miditype, "");
		}
#endif
	}

	// Check for various raw OPL formats
	else if (
		(id[0] == MAKE_ID('R','A','W','A') && id[1] == MAKE_ID('D','A','T','A')) ||		// Rdos Raw OPL
		(id[0] == MAKE_ID('D','B','R','A') && id[1] == MAKE_ID('W','O','P','L')) ||		// DosBox Raw OPL
		(id[0] == MAKE_ID('A','D','L','I') && *((BYTE *)id + 4) == 'B'))		// Martin Fernandez's modified IMF
	{
		info = new OPLMUSSong (*reader, device != NULL? device->args.GetChars() : "");
	}
	// Check for game music
	else if ((fmt = GME_CheckFormat(id[0])) != NULL && fmt[0] != '\0')
	{
		info = GME_OpenSong(*reader, fmt);
	}
	// Check for module formats
	else
	{
		info = MOD_OpenSong(*reader);
	}

    if (info == NULL)
    {
        // Check for CDDA "format"
        if (id[0] == (('R')|(('I')<<8)|(('F')<<16)|(('F')<<24)))
        {
            DWORD subid;

            reader->Seek(8, SEEK_CUR);
            if (reader->Read (&subid, 4) != 4)
            {
                delete reader;
                return 0;
            }
            reader->Seek(-12, SEEK_CUR);

            if (subid == (('C')|(('D')<<8)|(('D')<<16)|(('A')<<24)))
            {
                // This is a CDDA file
                info = new CDDAFile (*reader);
            }
        }

        // no support in sound system => no modules/streams
        // 1024 bytes is an arbitrary restriction. It's assumed that anything
        // smaller than this can't possibly be a valid music file if it hasn't
        // been identified already, so don't even bother trying to load it.
        // Of course MIDIs shorter than 1024 bytes should pass.
        if (info == NULL && (reader->GetLength() >= 1024 || id[0] == MAKE_ID('M','T','h','d')))
        {
            // Let the sound system figure out what it is.
            info = new StreamSong (reader);
			// Assumed ownership
			reader = NULL;
        }
    }

	if (reader != NULL) delete reader;

	if (info && !info->IsValid ())
	{
		delete info;
		info = NULL;
	}

	return info;
}